

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O2

void __thiscall
crnlib::sparse_bit_array::sparse_bit_array(sparse_bit_array *this,sparse_bit_array *other)

{
  uint uVar1;
  uint32 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint32 **ppuVar10;
  uint32 *puVar11;
  uint i;
  ulong uVar12;
  
  uVar1 = other->m_num_groups;
  this->m_num_groups = uVar1;
  ppuVar10 = (uint32 **)crnlib_malloc((ulong)uVar1 << 3);
  this->m_ppGroups = ppuVar10;
  if (ppuVar10 == (uint32 **)0x0) {
    crnlib_assert("m_ppGroups",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                  ,0x2e);
  }
  for (uVar12 = 0; uVar12 < this->m_num_groups; uVar12 = uVar12 + 1) {
    if (other->m_ppGroups[uVar12] == (uint32 *)0x0) {
      this->m_ppGroups[uVar12] = (uint32 *)0x0;
    }
    else {
      puVar11 = alloc_group(false);
      this->m_ppGroups[uVar12] = puVar11;
      puVar11 = this->m_ppGroups[uVar12];
      puVar2 = other->m_ppGroups[uVar12];
      uVar3 = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      uVar5 = *(undefined8 *)(puVar2 + 4);
      uVar6 = *(undefined8 *)(puVar2 + 6);
      uVar7 = *(undefined8 *)(puVar2 + 8);
      uVar8 = *(undefined8 *)(puVar2 + 10);
      uVar9 = *(undefined8 *)(puVar2 + 0xe);
      *(undefined8 *)(puVar11 + 0xc) = *(undefined8 *)(puVar2 + 0xc);
      *(undefined8 *)(puVar11 + 0xe) = uVar9;
      *(undefined8 *)(puVar11 + 8) = uVar7;
      *(undefined8 *)(puVar11 + 10) = uVar8;
      *(undefined8 *)(puVar11 + 4) = uVar5;
      *(undefined8 *)(puVar11 + 6) = uVar6;
      *(undefined8 *)puVar11 = uVar3;
      *(undefined8 *)(puVar11 + 2) = uVar4;
    }
  }
  return;
}

Assistant:

sparse_bit_array::sparse_bit_array(sparse_bit_array& other)
    {
        m_num_groups = other.m_num_groups;
        m_ppGroups = (uint32**)crnlib_malloc(m_num_groups * sizeof(uint32*));
        CRNLIB_VERIFY(m_ppGroups);

        for (uint i = 0; i < m_num_groups; i++)
        {
            if (other.m_ppGroups[i])
            {
                m_ppGroups[i] = alloc_group(false);
                memcpy(m_ppGroups[i], other.m_ppGroups[i], cBytesPerGroup);
            }
            else
            {
                m_ppGroups[i] = nullptr;
            }
        }
    }